

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  Rep *pRVar7;
  long lVar8;
  long lVar9;
  
  sVar3 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar9 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  pRVar7 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar7 != (Rep *)0x0) {
    pRVar7 = (Rep *)pRVar7->elements;
  }
  sVar3 = sVar3 + lVar9 * 2;
  if (lVar9 != 0) {
    lVar8 = 0;
    do {
      sVar4 = UninterpretedOption::ByteSizeLong
                        (*(UninterpretedOption **)((long)pRVar7->elements + lVar8 + -8));
      uVar2 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar9 * 8 != lVar8);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x3f) != 0) {
    if ((uVar2 & 1) != 0) {
      if (this->ctype_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar6 = this->ctype_ | 1;
        iVar1 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      sVar3 = sVar3 + uVar5;
    }
    sVar3 = ((uVar2 >> 3 & 2) + (uVar2 >> 2 & 2) + (uVar2 >> 1 & 2) + (uVar2 & 2)) + sVar3;
    if ((uVar2 & 0x20) != 0) {
      if (this->jstype_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar2 = this->jstype_ | 1;
        iVar1 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      sVar3 = sVar3 + uVar5;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t FieldOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_ctype());
    }

    // optional bool packed = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 + 1;
    }

    // optional bool weak = 10 [default = false];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_jstype());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}